

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_buffer__do_pushv(ptls_buffer_t *buf,void *src,size_t len)

{
  int ret;
  size_t len_local;
  void *src_local;
  ptls_buffer_t *buf_local;
  
  if (len == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    buf_local._4_4_ = ptls_buffer_reserve(buf,len);
    if (buf_local._4_4_ == 0) {
      memcpy(buf->base + buf->off,src,len);
      buf->off = len + buf->off;
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int ptls_buffer__do_pushv(ptls_buffer_t *buf, const void *src, size_t len)
{
    int ret;

    if (len == 0)
        return 0;
    if ((ret = ptls_buffer_reserve(buf, len)) != 0)
        return ret;
    memcpy(buf->base + buf->off, src, len);
    buf->off += len;
    return 0;
}